

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_NtkParseInt2(char *pStr,Ifn_Ntk_t *p)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  char cVar15;
  int iVar16;
  bool bVar17;
  
  iVar4 = Ifn_ManStrCheck2(pStr,&p->nInps,&p->nObjs);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    uVar6 = p->nInps;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 0xc) {
      if ((((int)uVar6 < 2) || (iVar3 = p->nObjs, iVar3 <= (int)uVar6)) || (0x15 < iVar3)) {
        __assert_fail("p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                      ,0x181,"int Ifn_NtkParseInt2(char *, Ifn_Ntk_t *)");
      }
      piVar9 = p->Nodes[uVar5].Fanins;
      do {
        cVar15 = *pStr;
        bVar17 = cVar15 == '\0';
        iVar4 = (int)uVar5;
        if (bVar17) {
LAB_003bbe4d:
          uVar5 = (ulong)(iVar4 + 0x61);
          pcVar8 = "Cannot find definition of signal \'%c\'.\n";
LAB_003bbe57:
          Ifn_ErrorMessage(pcVar8,uVar5);
          return 0;
        }
        uVar6 = 3;
        lVar12 = 0;
        pcVar8 = pStr + 3;
        while ((uVar5 + 0x61 != (ulong)(uint)(int)cVar15 || (pStr[lVar12 + 1] != '='))) {
          cVar15 = pStr[lVar12 + 1];
          lVar12 = lVar12 + 1;
          pcVar8 = pcVar8 + 1;
          uVar6 = uVar6 + 1;
          bVar17 = cVar15 == '\0';
          if (bVar17) goto LAB_003bbe4d;
        }
        if (bVar17) goto LAB_003bbe4d;
        bVar1 = pStr[lVar12 + 2];
        if (bVar1 < 0x5b) {
          if (bVar1 == 0x28) {
            cVar15 = ')';
            uVar13 = 3;
          }
          else {
            if (bVar1 != 0x3c) {
LAB_003bbe9c:
              uVar5 = (ulong)(iVar4 + 0x61);
              pcVar8 = "Cannot find openning operation symbol in the definition of signal \'%c\'.\n"
              ;
              goto LAB_003bbe57;
            }
            cVar15 = '>';
            uVar13 = 5;
          }
        }
        else if (bVar1 == 0x7b) {
          cVar15 = '}';
          uVar13 = 6;
        }
        else {
          if (bVar1 != 0x5b) goto LAB_003bbe9c;
          cVar15 = ']';
          uVar13 = 4;
        }
        *(uint *)(p->Nodes + uVar5) = *(uint *)(p->Nodes + uVar5) & 0xfffffff8 | uVar13;
        uVar14 = 0xf8;
        uVar13 = 0;
        iVar11 = -1;
        do {
          iVar16 = iVar11;
          uVar10 = uVar13;
          cVar2 = *pcVar8;
          uVar14 = uVar14 + 8;
          if (cVar2 == '\0') break;
          pcVar8 = pcVar8 + 1;
          uVar13 = uVar10 + 1;
          iVar11 = iVar16 + 1;
        } while (cVar15 != cVar2);
        if (cVar2 == '\0') {
          uVar5 = (ulong)(iVar4 + 0x61);
          pcVar8 = "Cannot find closing operation symbol in the definition of signal \'%c\'.\n";
          goto LAB_003bbe57;
        }
        iVar16 = iVar16 + 4;
        if (0xb < iVar16) {
          uVar5 = (ulong)(iVar4 + 0x61);
          pcVar8 = "Cannot find matching operation symbol in the definition of signal \'%c\'.\n";
          goto LAB_003bbe57;
        }
        if (3 < iVar16) {
          uVar7 = 0;
          do {
            if ((pStr[uVar7 + uVar6] < 0x61) ||
               (iVar11 = pStr[uVar7 + uVar6] + -0x61, iVar4 <= iVar11)) {
              uVar5 = (ulong)(iVar4 + 0x61);
              pcVar8 = "Fanin number %d is signal %d is out of range.\n";
              goto LAB_003bbc90;
            }
            piVar9[uVar7] = iVar11;
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        *(uint *)(p->Nodes + uVar5) = *(uint *)(p->Nodes + uVar5) & 0xffffff07 | uVar14 & 0xf8;
        uVar5 = uVar5 + 1;
        piVar9 = piVar9 + 0xc;
        iVar4 = 1;
      } while ((int)uVar5 < iVar3);
    }
    else {
      pcVar8 = 
      "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n"
      ;
      uVar7 = (ulong)uVar6;
      uVar5 = 0xb;
LAB_003bbc90:
      iVar4 = 0;
      Ifn_ErrorMessage(pcVar8,uVar7,uVar5);
    }
  }
  return iVar4;
}

Assistant:

int Ifn_NtkParseInt2( char * pStr, Ifn_Ntk_t * p )
{
    int i, k, n, f, nFans, iFan;
    if ( !Ifn_ManStrCheck2(pStr, &p->nInps, &p->nObjs) )
        return 0;
    if ( p->nInps > IFN_INS )
        return Ifn_ErrorMessage( "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n", p->nInps, IFN_INS );
    assert( p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        char Next = 0;
        for ( k = 0; pStr[k]; k++ )
            if ( pStr[k] == 'a' + i && pStr[k+1] == '=' )
                break;
        if ( pStr[k] == 0 )
            return Ifn_ErrorMessage( "Cannot find definition of signal \'%c\'.\n", 'a' + i );
        if ( pStr[k+2] == '(' )
            p->Nodes[i].Type = IFN_DSD_AND, Next = ')';
        else if ( pStr[k+2] == '[' )
            p->Nodes[i].Type = IFN_DSD_XOR, Next = ']';
        else if ( pStr[k+2] == '<' )
            p->Nodes[i].Type = IFN_DSD_MUX, Next = '>';
        else if ( pStr[k+2] == '{' )
            p->Nodes[i].Type = IFN_DSD_PRIME, Next = '}';
        else 
            return Ifn_ErrorMessage( "Cannot find openning operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( n = k + 3; pStr[n]; n++ )
            if ( pStr[n] == Next )
                break;
        if ( pStr[n] == 0 )
            return Ifn_ErrorMessage( "Cannot find closing operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        nFans = n - k - 3;
        if ( nFans > 8 )
            return Ifn_ErrorMessage( "Cannot find matching operation symbol in the definition of signal \'%c\'.\n", 'a' + i );
        for ( f = 0; f < nFans; f++ )
        {
            iFan = pStr[k + 3 + f] - 'a';
            if ( iFan < 0 || iFan >= i )
                return Ifn_ErrorMessage( "Fanin number %d is signal %d is out of range.\n", f, 'a' + i );
            p->Nodes[i].Fanins[f] = iFan;
        }
        p->Nodes[i].nFanins = nFans;
    }
    return 1;
}